

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::GetNode
          (TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *this,AActor *key)

{
  TValueTraits<bool> local_29;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *pTStack_28;
  TValueTraits<bool> traits;
  Node *n;
  AActor *key_local;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *this_local;
  
  pTStack_28 = (TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *)FindKey(this,key)
  ;
  this_local = pTStack_28;
  if (pTStack_28 == (TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *)0x0) {
    pTStack_28 = (TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> *)
                 NewKey(this,key);
    TValueTraits<bool>::Init(&local_29,(bool *)&pTStack_28->Size);
    this_local = pTStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}